

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

int google::protobuf::UnescapeCEscapeSequences
              (char *source,char *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char *d;
  char *p;
  byte *pbVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  
  iVar3 = (int)dest;
  if (source == dest) {
    do {
      if ((*source == 0) || (*source == 0x5c)) break;
      pbVar4 = (byte *)source + 1;
      pbVar1 = (byte *)dest + 1;
      bVar8 = dest == source;
      dest = (char *)pbVar1;
      source = (char *)pbVar4;
    } while (bVar8);
  }
  do {
    bVar7 = *source;
    if (bVar7 != 0x5c) {
      pbVar4 = (byte *)source;
      if (bVar7 != 0) goto LAB_00307620;
LAB_00307634:
      *dest = 0;
      return (int)dest - iVar3;
    }
    pbVar4 = (byte *)source + 1;
    bVar7 = ((byte *)source)[1];
    uVar5 = (uint)bVar7;
    if (bVar7 < 0x3f) {
      if (0x2f < bVar7) {
        if (uVar5 - 0x30 < 8) {
          bVar2 = bVar7 - 0x30;
          pbVar1 = pbVar4;
          if ((((byte *)source)[2] & 0xf8) == 0x30) {
            bVar2 = ((bVar7 - 0x30) * '\b' + ((byte *)source)[2]) - 0x30;
            pbVar1 = (byte *)source + 2;
          }
          pbVar4 = pbVar1 + 1;
          bVar7 = (bVar2 * '\b' + pbVar1[1]) - 0x30;
          if ((pbVar1[1] & 0xf8) != 0x30) {
            pbVar4 = pbVar1;
            bVar7 = bVar2;
          }
          goto LAB_00307620;
        }
        goto switchD_003074bd_caseD_6f;
      }
      if ((bVar7 == 0x22) || (bVar7 == 0x27)) goto LAB_00307620;
      if (bVar7 == 0) goto LAB_00307634;
    }
    else {
      if (bVar7 < 0x62) {
        if (bVar7 < 0x5c) {
          if (uVar5 == 0x3f) goto LAB_00307620;
          if (bVar7 == 0x58) goto switchD_003074bd_caseD_78;
        }
        else if ((bVar7 == 0x5c) || (bVar7 = 7, uVar5 == 0x61)) goto LAB_00307620;
        goto switchD_003074bd_caseD_6f;
      }
      switch(bVar7) {
      case 0x6e:
        bVar7 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x75:
      case 0x77:
        goto switchD_003074bd_caseD_6f;
      case 0x72:
        bVar7 = 0xd;
        break;
      case 0x74:
        bVar7 = 9;
        break;
      case 0x76:
        bVar7 = 0xb;
        break;
      case 0x78:
switchD_003074bd_caseD_78:
        if (((byte)(((byte *)source)[2] - 0x30) < 10) ||
           ((uVar5 = ((byte *)source)[2] - 0x41, uVar5 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))) {
          bVar7 = 0;
          while ((bVar2 = pbVar4[1], (byte)(bVar2 - 0x30) < 10 ||
                 ((bVar2 - 0x41 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0))))) {
            pbVar4 = pbVar4 + 1;
            bVar6 = bVar2 + 9;
            if (bVar2 < 0x3a) {
              bVar6 = bVar2;
            }
            bVar7 = bVar6 & 0xf | bVar7 << 4;
          }
          break;
        }
        goto switchD_003074bd_caseD_6f;
      default:
        if (bVar7 == 0x66) {
          bVar7 = 0xc;
        }
        else {
          if (bVar7 != 0x62) goto switchD_003074bd_caseD_6f;
          bVar7 = 8;
        }
      }
LAB_00307620:
      *dest = bVar7;
      dest = (char *)((byte *)dest + 1);
    }
switchD_003074bd_caseD_6f:
    source = (char *)(pbVar4 + 1);
  } while( true );
}

Assistant:

int UnescapeCEscapeSequences(const char* source, char* dest,
                             std::vector<string> *errors) {
  GOOGLE_DCHECK(errors == nullptr) << "Error reporting not implemented.";

  char* d = dest;
  const char* p = source;

  // Small optimization for case where source = dest and there's no escaping
  while ( p == d && *p != '\0' && *p != '\\' )
    p++, d++;

  while (*p != '\0') {
    if (*p != '\\') {
      *d++ = *p++;
    } else {
      switch ( *++p ) {                    // skip past the '\\'
        case '\0':
          LOG_STRING(ERROR, errors) << "String cannot end with \\";
          *d = '\0';
          return d - dest;   // we're done with p
        case 'a':  *d++ = '\a';  break;
        case 'b':  *d++ = '\b';  break;
        case 'f':  *d++ = '\f';  break;
        case 'n':  *d++ = '\n';  break;
        case 'r':  *d++ = '\r';  break;
        case 't':  *d++ = '\t';  break;
        case 'v':  *d++ = '\v';  break;
        case '\\': *d++ = '\\';  break;
        case '?':  *d++ = '\?';  break;    // \?  Who knew?
        case '\'': *d++ = '\'';  break;
        case '"':  *d++ = '\"';  break;
        case '0': case '1': case '2': case '3':  // octal digit: 1 to 3 digits
        case '4': case '5': case '6': case '7': {
          char ch = *p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )
            ch = ch * 8 + *++p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )      // safe (and easy) to do this twice
            ch = ch * 8 + *++p - '0';      // now points at last digit
          *d++ = ch;
          break;
        }
        case 'x': case 'X': {
          if (!isxdigit(p[1])) {
            if (p[1] == '\0') {
              LOG_STRING(ERROR, errors) << "String cannot end with \\x";
            } else {
              LOG_STRING(ERROR, errors) <<
                "\\x cannot be followed by non-hex digit: \\" << *p << p[1];
            }
            break;
          }
          unsigned int ch = 0;
          const char *hex_start = p;
          while (isxdigit(p[1]))  // arbitrarily many hex digits
            ch = (ch << 4) + hex_digit_to_int(*++p);
          if (ch > 0xFF)
            LOG_STRING(ERROR, errors) << "Value of " <<
              "\\" << string(hex_start, p+1-hex_start) << " exceeds 8 bits";
          *d++ = ch;
          break;
        }
#if 0  // TODO(kenton):  Support \u and \U?  Requires runetochar().
        case 'u': {
          // \uhhhh => convert 4 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 4; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              rune = (rune << 4) + hex_digit_to_int(*++p);  // Advance p.
            } else {
              LOG_STRING(ERROR, errors)
                << "\\u must be followed by 4 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
        case 'U': {
          // \Uhhhhhhhh => convert 8 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 8; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              // Don't change rune until we're sure this
              // is within the Unicode limit, but do advance p.
              char32 newrune = (rune << 4) + hex_digit_to_int(*++p);
              if (newrune > 0x10FFFF) {
                LOG_STRING(ERROR, errors)
                  << "Value of \\"
                  << string(hex_start, p + 1 - hex_start)
                  << " exceeds Unicode limit (0x10FFFF)";
                break;
              } else {
                rune = newrune;
              }
            } else {
              LOG_STRING(ERROR, errors)
                << "\\U must be followed by 8 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
#endif
        default:
          LOG_STRING(ERROR, errors) << "Unknown escape sequence: \\" << *p;
      }
      p++;                                 // read past letter we escaped
    }
  }
  *d = '\0';
  return d - dest;
}